

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

uchar GetDepth(Col_Word list)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  
  pbVar1 = (byte *)list;
  do {
    pbVar3 = pbVar1;
    uVar2 = 0;
    if (pbVar3 != (byte *)0x0) {
      if (((ulong)pbVar3 & 0xf) == 0) {
        uVar2 = -(uint)((*pbVar3 & 2) == 0) | *pbVar3 & 0xfffffffe;
      }
      else {
        uVar2 = immediateWordTypes[(uint)pbVar3 & 0x1f];
      }
    }
    pbVar1 = (byte *)(list & 0xfffffffffffffff7);
  } while (uVar2 == 0xfffffffa);
  if ((uVar2 < 0x27) && ((0x4440000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
    return pbVar3[1];
  }
  return '\0';
}

Assistant:

static unsigned char
GetDepth(
    Col_Word rope)  /*!< Rope node to get depth from. */
{
    switch (WORD_TYPE(rope)) {
    case WORD_TYPE_SUBROPE:
        return WORD_SUBROPE_DEPTH(rope);

    case WORD_TYPE_CONCATROPE:
        return WORD_CONCATROPE_DEPTH(rope);

    /* WORD_TYPE_UNKNOWN */

    default:
        return 0;
    }
}